

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O2

uchar __thiscall wabt::interp::Istream::ReadAt<unsigned_char>(Istream *this,Offset *offset)

{
  uchar uVar1;
  uint uVar2;
  pointer puVar3;
  
  uVar2 = *offset;
  puVar3 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar2 <
      (ulong)((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
    uVar1 = puVar3[uVar2];
    *offset = uVar2 + 1;
    return uVar1;
  }
  __assert_fail("*offset + sizeof(T) <= data_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/istream.cc"
                ,0x62,"T wabt::interp::Istream::ReadAt(Offset *) const [T = unsigned char]");
}

Assistant:

T WABT_VECTORCALL Istream::ReadAt(Offset* offset) const {
  assert(*offset + sizeof(T) <= data_.size());
  T result;
  memcpy(&result, data_.data() + *offset, sizeof(T));
  *offset += sizeof(T);
  return result;
}